

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  vector<generator::a_t,_std::allocator<generator::a_t>_> list;
  a_t a;
  string_t content;
  ofstream out;
  tag_b_t<cfgfile::string_trait_t> tag;
  vector<generator::a_t,_std::allocator<generator::a_t>_> local_398;
  value_type local_380;
  long *local_360;
  long local_358;
  long local_350 [2];
  b_t local_340;
  long *local_320;
  filebuf local_318 [8];
  long local_310 [2];
  int aiStack_300 [54];
  ios_base local_228 [264];
  tag_b_t<cfgfile::string_trait_t> local_120;
  
  local_340.m_a_vector.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_340.m_a_vector.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_340.m_a_vector.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340.m_integer_field = 100;
  local_398.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &local_380.m_string_field.field_2;
  local_380.m_string_field._M_string_length = 0;
  local_380.m_string_field.field_2._M_local_buf[0] = '\0';
  local_380.m_string_field._M_dataplus._M_p = (pointer)paVar1;
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"string","");
  std::__cxx11::string::_M_assign((string *)&local_380);
  if (local_320 != local_310) {
    operator_delete(local_320,local_310[0] + 1);
  }
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::push_back(&local_398,&local_380);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::operator=
            (&local_340.m_a_vector,&local_398);
  std::ofstream::ofstream(&local_320,"generator.cfg",_S_out);
  generator::tag_b_t<cfgfile::string_trait_t>::tag_b_t(&local_120,&local_340);
  iVar2 = *(int *)((long)aiStack_300 + local_320[-3]);
  if (iVar2 == 0) {
    (*local_120.super_tag_scalar_t<int,_cfgfile::string_trait_t>.
      super_tag_t<cfgfile::string_trait_t>._vptr_tag_t[3])(&local_360,&local_120,0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_320,(char *)local_360,local_358);
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    iVar3 = 0;
    std::ofstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Fialed to save configuration. Can\'t open file to write.",0x37
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    iVar3 = 1;
    std::ostream::flush();
  }
  local_120.super_tag_scalar_t<int,_cfgfile::string_trait_t>.super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_b_t_0010fa70;
  cfgfile::
  tag_vector_of_tags_t<generator::tag_a_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
  ~tag_vector_of_tags_t(&local_120.m_a_vector);
  cfgfile::tag_t<cfgfile::string_trait_t>::~tag_t((tag_t<cfgfile::string_trait_t> *)&local_120);
  if (iVar2 == 0) {
    iVar3 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Configuration saved to \"generator.cfg\".\n",0x28);
  }
  local_320 = _VTT;
  *(undefined8 *)(local_318 + _VTT[-3] + -8) = __filebuf;
  std::filebuf::~filebuf(local_318);
  std::ios_base::~ios_base(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.m_string_field._M_dataplus._M_p != paVar1) {
    operator_delete(local_380.m_string_field._M_dataplus._M_p,
                    CONCAT71(local_380.m_string_field.field_2._M_allocated_capacity._1_7_,
                             local_380.m_string_field.field_2._M_local_buf[0]) + 1);
  }
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::~vector(&local_398);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::~vector(&local_340.m_a_vector);
  return iVar3;
}

Assistant:

int main()
{
	generator::b_t b;
	b.set_integer_field( 100 );

	std::vector< generator::a_t > list;
	generator::a_t a;
	a.set_string_field( "string" );
	list.push_back( a );

	b.set_a_vector( list );

	std::ofstream out( "generator.cfg" );

	try {
		generator::tag_b_t< cfgfile::string_trait_t > tag( b );

		if( out.good() )
		{
			cfgfile::write_cfgfile( tag, out );

			out.close();
		}
		else
		{
			std::cout << "Fialed to save configuration. Can't open file to write."
				<< std::endl;

			return 1;
		}
	}
	catch( const cfgfile::exception_t< cfgfile::string_trait_t > & x )
	{
		out.close();

		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::cout << "Configuration saved to \"generator.cfg\".\n";

	return 0;
}